

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function_simd.cpp
# Opt level: O3

void avx::AbsoluteDifference
               (uint32_t rowSizeIn1,uint32_t rowSizeIn2,uint32_t rowSizeOut,uint8_t *in1Y,
               uint8_t *in2Y,uint8_t *outY,uint8_t *outYEnd,uint32_t simdWidth,
               uint32_t totalSimdWidth,uint32_t nonSimdWidth)

{
  byte bVar1;
  byte bVar2;
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  uint8_t uVar5;
  long lVar6;
  ulong uVar7;
  uint8_t *puVar8;
  uint8_t *puVar9;
  uint8_t *puVar10;
  
  if (outY != outYEnd) {
    uVar7 = (ulong)totalSimdWidth;
    puVar8 = outY + uVar7;
    puVar9 = in2Y + uVar7;
    puVar10 = in1Y + uVar7;
    do {
      if (simdWidth != 0) {
        lVar6 = 0;
        do {
          auVar4 = vpminub_avx2(*(undefined1 (*) [32])(in1Y + lVar6),
                                *(undefined1 (*) [32])(in2Y + lVar6));
          auVar3 = vpmaxub_avx2(*(undefined1 (*) [32])(in1Y + lVar6),
                                *(undefined1 (*) [32])(in2Y + lVar6));
          auVar3 = vpsubb_avx2(auVar3,auVar4);
          *(undefined1 (*) [32])(outY + lVar6) = auVar3;
          lVar6 = lVar6 + 0x20;
        } while ((ulong)simdWidth << 5 != lVar6);
      }
      if (nonSimdWidth != 0) {
        uVar7 = 0;
        do {
          bVar1 = puVar10[uVar7];
          bVar2 = puVar9[uVar7];
          uVar5 = -(bVar1 - bVar2);
          if (bVar2 <= bVar1) {
            uVar5 = bVar1 - bVar2;
          }
          puVar8[uVar7] = uVar5;
          uVar7 = uVar7 + 1;
        } while (nonSimdWidth != uVar7);
      }
      outY = outY + rowSizeOut;
      in1Y = in1Y + rowSizeIn1;
      in2Y = in2Y + rowSizeIn2;
      puVar8 = puVar8 + rowSizeOut;
      puVar9 = puVar9 + rowSizeIn2;
      puVar10 = puVar10 + rowSizeIn1;
    } while (outY != outYEnd);
  }
  return;
}

Assistant:

void AbsoluteDifference( uint32_t rowSizeIn1, uint32_t rowSizeIn2, uint32_t rowSizeOut, const uint8_t * in1Y, const uint8_t * in2Y,
                             uint8_t * outY, const uint8_t * outYEnd, uint32_t simdWidth, uint32_t totalSimdWidth, uint32_t nonSimdWidth )
    {
        for( ; outY != outYEnd; outY += rowSizeOut, in1Y += rowSizeIn1, in2Y += rowSizeIn2 ) {
            const simd * src1 = reinterpret_cast <const simd*> (in1Y);
            const simd * src2 = reinterpret_cast <const simd*> (in2Y);
            simd       * dst  = reinterpret_cast <simd*> (outY);

            const simd * src1End = src1 + simdWidth;

            for( ; src1 != src1End; ++src1, ++src2, ++dst ) {
                simd data1 = _mm256_loadu_si256( src1 );
                simd data2 = _mm256_loadu_si256( src2 );
                _mm256_storeu_si256( dst, _mm256_sub_epi8( _mm256_max_epu8( data1, data2 ), _mm256_min_epu8( data1, data2 ) ) );
            }

            if( nonSimdWidth > 0 ) {
                const uint8_t * in1X = in1Y + totalSimdWidth;
                const uint8_t * in2X = in2Y + totalSimdWidth;
                uint8_t       * outX = outY + totalSimdWidth;

                const uint8_t * outXEnd = outX + nonSimdWidth;

                for( ; outX != outXEnd; ++outX, ++in1X, ++in2X )
                    (*outX) = static_cast<uint8_t>( (*in2X) > (*in1X) ? (*in2X) - (*in1X) : (*in1X) - (*in2X) );
            }
        }
    }